

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall CLIntercept::initPrecompiledKernelOverrides(CLIntercept *this,cl_context context)

{
  double dVar1;
  size_t sVar2;
  cl_int cVar3;
  mapped_type *ppSVar4;
  mapped_type pSVar5;
  cl_program p_Var6;
  void *pvVar7;
  cl_kernel p_Var8;
  char *pcVar9;
  ulong uVar10;
  CPrecompiledKernelOverridesMap *this_00;
  pthread_mutex_t *__mutex;
  cl_int errorCode;
  allocator local_99;
  pthread_mutex_t *local_98;
  cl_context context_local;
  cl_uint numDevices;
  size_t buildLogSize;
  char *pProgramString;
  void *local_70;
  string local_68 [32];
  mapped_type local_48;
  CPrecompiledKernelOverridesMap *local_40;
  size_t programStringLength;
  
  __mutex = (pthread_mutex_t *)&this->m_Mutex;
  context_local = context;
  std::mutex::lock((mutex *)&__mutex->__data);
  dVar1 = (double)std::__cxx11::string::string
                            (local_68,"Initializing precompiled kernel overrides...\n",
                             (allocator *)&pProgramString);
  log(this,dVar1);
  std::__cxx11::string::~string(local_68);
  errorCode = 0;
  this_00 = &this->m_PrecompiledKernelOverridesMap;
  ppSVar4 = std::
            map<_cl_context_*,_CLIntercept::SPrecompiledKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SPrecompiledKernelOverrides_*>_>_>
            ::operator[](this_00,&context_local);
  pSVar5 = *ppSVar4;
  if (pSVar5 != (mapped_type)0x0) {
    errorCode = (*(this->m_Dispatch).clReleaseKernel)(pSVar5->Kernel_CopyBufferBytes);
    errorCode = (*(this->m_Dispatch).clReleaseKernel)(pSVar5->Kernel_CopyBufferUInts);
    errorCode = (*(this->m_Dispatch).clReleaseKernel)(pSVar5->Kernel_CopyBufferUInt4s);
    errorCode = (*(this->m_Dispatch).clReleaseKernel)(pSVar5->Kernel_CopyBufferUInt16s);
    errorCode = (*(this->m_Dispatch).clReleaseKernel)(pSVar5->Kernel_CopyImage2Dto2DFloat);
    errorCode = (*(this->m_Dispatch).clReleaseKernel)(pSVar5->Kernel_CopyImage2Dto2DInt);
    errorCode = (*(this->m_Dispatch).clReleaseKernel)(pSVar5->Kernel_CopyImage2Dto2DUInt);
    errorCode = (*(this->m_Dispatch).clReleaseProgram)(pSVar5->Program);
    operator_delete(pSVar5);
    ppSVar4 = std::
              map<_cl_context_*,_CLIntercept::SPrecompiledKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SPrecompiledKernelOverrides_*>_>_>
              ::operator[](this_00,&context_local);
    *ppSVar4 = (mapped_type)0x0;
  }
  pSVar5 = (mapped_type)operator_new(0x40);
  pSVar5->Kernel_CopyImage2Dto2DInt = (cl_kernel)0x0;
  pSVar5->Kernel_CopyImage2Dto2DUInt = (cl_kernel)0x0;
  pProgramString = (char *)0x0;
  pSVar5->Kernel_CopyBufferUInt16s = (cl_kernel)0x0;
  pSVar5->Kernel_CopyImage2Dto2DFloat = (cl_kernel)0x0;
  programStringLength = 0;
  pSVar5->Kernel_CopyBufferUInts = (cl_kernel)0x0;
  pSVar5->Kernel_CopyBufferUInt4s = (cl_kernel)0x0;
  pSVar5->Program = (cl_program)0x0;
  pSVar5->Kernel_CopyBufferBytes = (cl_kernel)0x0;
  if (errorCode == 0) {
    pProgramString = &_binary_kernels_precompiled_kernels_cl_start;
    programStringLength = (size_t)&_binary_kernels_precompiled_kernels_cl_size;
    p_Var6 = (*(this->m_Dispatch).clCreateProgramWithSource)
                       (context_local,1,&pProgramString,&programStringLength,&errorCode);
    pSVar5->Program = p_Var6;
    if ((errorCode == 0) &&
       (errorCode = (*(this->m_Dispatch).clBuildProgram)
                              (p_Var6,0,(cl_device_id *)0x0,(char *)0x0,
                               (_func_void_cl_program_void_ptr *)0x0,(void *)0x0), errorCode != 0))
    {
      numDevices = 0;
      local_98 = __mutex;
      local_48 = pSVar5;
      local_40 = this_00;
      (*(this->m_Dispatch).clGetContextInfo)(context_local,0x1083,4,&numDevices,(size_t *)0x0);
      pSVar5 = local_48;
      this_00 = local_40;
      __mutex = local_98;
      if ((ulong)numDevices != 0) {
        uVar10 = (ulong)numDevices << 3;
        pvVar7 = operator_new__(uVar10);
        cVar3 = (*(this->m_Dispatch).clGetContextInfo)
                          (context_local,0x1081,uVar10,pvVar7,(size_t *)0x0);
        pSVar5 = local_48;
        this_00 = local_40;
        __mutex = local_98;
        if (cVar3 == 0) {
          local_70 = pvVar7;
          for (uVar10 = 0; pSVar5 = local_48, this_00 = local_40, __mutex = local_98,
              uVar10 < numDevices; uVar10 = uVar10 + 1) {
            buildLogSize = 0;
            (*(this->m_Dispatch).clGetProgramBuildInfo)
                      (p_Var6,*(cl_device_id *)((long)local_70 + uVar10 * 8),0x1183,0,(void *)0x0,
                       &buildLogSize);
            sVar2 = buildLogSize;
            pcVar9 = (char *)operator_new__(buildLogSize + 1);
            (*(this->m_Dispatch).clGetProgramBuildInfo)
                      (p_Var6,*(cl_device_id *)((long)local_70 + uVar10 * 8),0x1183,sVar2,pcVar9,
                       (size_t *)0x0);
            pcVar9[buildLogSize] = '\0';
            dVar1 = (double)std::__cxx11::string::string
                                      (local_68,"-------> Start of Build Log:\n",&local_99);
            log(this,dVar1);
            std::__cxx11::string::~string(local_68);
            dVar1 = (double)std::__cxx11::string::string(local_68,pcVar9,&local_99);
            log(this,dVar1);
            std::__cxx11::string::~string(local_68);
            dVar1 = (double)std::__cxx11::string::string
                                      (local_68,"<------- End of Build Log!\n",&local_99);
            log(this,dVar1);
            std::__cxx11::string::~string(local_68);
            operator_delete__(pcVar9);
          }
        }
      }
    }
  }
  else {
    p_Var6 = (cl_program)0x0;
  }
  if (((this->m_Config).OverrideReadBuffer == true) ||
     ((this->m_Config).OverrideWriteBuffer != false)) {
    if (errorCode == 0) {
LAB_0016ebf8:
      p_Var8 = (*(this->m_Dispatch).clCreateKernel)(p_Var6,"CopyBufferBytes",&errorCode);
      pSVar5->Kernel_CopyBufferBytes = p_Var8;
      if (errorCode == 0) {
        p_Var8 = (*(this->m_Dispatch).clCreateKernel)(p_Var6,"CopyBufferUInts",&errorCode);
        pSVar5->Kernel_CopyBufferUInts = p_Var8;
        if (errorCode == 0) {
          p_Var8 = (*(this->m_Dispatch).clCreateKernel)(p_Var6,"CopyBufferUInt4s",&errorCode);
          pSVar5->Kernel_CopyBufferUInt4s = p_Var8;
          if (errorCode == 0) {
            p_Var8 = (*(this->m_Dispatch).clCreateKernel)(p_Var6,"CopyBufferUInt16s",&errorCode);
            pSVar5->Kernel_CopyBufferUInt16s = p_Var8;
          }
        }
      }
    }
  }
  else if (((this->m_Config).OverrideCopyBuffer & errorCode == 0) != 0) goto LAB_0016ebf8;
  if ((((this->m_Config).OverrideReadImage == false) &&
      ((this->m_Config).OverrideWriteImage == false)) &&
     ((this->m_Config).OverrideCopyImage != true)) {
LAB_0016ecf6:
    if (errorCode == 0) {
      ppSVar4 = std::
                map<_cl_context_*,_CLIntercept::SPrecompiledKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SPrecompiledKernelOverrides_*>_>_>
                ::operator[](this_00,&context_local);
      *ppSVar4 = pSVar5;
      goto LAB_0016ed05;
    }
  }
  else if (errorCode == 0) {
    p_Var8 = (*(this->m_Dispatch).clCreateKernel)(p_Var6,"CopyImage2Dto2DFloat",&errorCode);
    pSVar5->Kernel_CopyImage2Dto2DFloat = p_Var8;
    if (errorCode == 0) {
      p_Var8 = (*(this->m_Dispatch).clCreateKernel)(pSVar5->Program,"CopyImage2Dto2DInt",&errorCode)
      ;
      pSVar5->Kernel_CopyImage2Dto2DInt = p_Var8;
      if (errorCode == 0) {
        p_Var8 = (*(this->m_Dispatch).clCreateKernel)
                           (pSVar5->Program,"CopyImage2Dto2DUInt",&errorCode);
        pSVar5->Kernel_CopyImage2Dto2DUInt = p_Var8;
        goto LAB_0016ecf6;
      }
    }
  }
  operator_delete(pSVar5);
LAB_0016ed05:
  dVar1 = (double)std::__cxx11::string::string
                            (local_68,"... precompiled kernel override initialization complete.\n",
                             (allocator *)&pProgramString);
  log(this,dVar1);
  std::__cxx11::string::~string(local_68);
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void CLIntercept::initPrecompiledKernelOverrides(
    const cl_context context )
{
    std::lock_guard<std::mutex> lock(m_Mutex);
    log( "Initializing precompiled kernel overrides...\n" );

    cl_int  errorCode = CL_SUCCESS;

    // Check to see if overrides already exist.  If they do, release them.
    SPrecompiledKernelOverrides*    pOverrides =
        m_PrecompiledKernelOverridesMap[ context ];
    if( pOverrides )
    {
        errorCode = dispatch().clReleaseKernel( pOverrides->Kernel_CopyBufferBytes );
        errorCode = dispatch().clReleaseKernel( pOverrides->Kernel_CopyBufferUInts );
        errorCode = dispatch().clReleaseKernel( pOverrides->Kernel_CopyBufferUInt4s );
        errorCode = dispatch().clReleaseKernel( pOverrides->Kernel_CopyBufferUInt16s );

        errorCode = dispatch().clReleaseKernel( pOverrides->Kernel_CopyImage2Dto2DFloat );
        errorCode = dispatch().clReleaseKernel( pOverrides->Kernel_CopyImage2Dto2DInt );
        errorCode = dispatch().clReleaseKernel( pOverrides->Kernel_CopyImage2Dto2DUInt );

        errorCode = dispatch().clReleaseProgram( pOverrides->Program );

        delete pOverrides;
        pOverrides = NULL;

        m_PrecompiledKernelOverridesMap[ context ] = NULL;
    }

    // Allocate new overrides.
    pOverrides = new SPrecompiledKernelOverrides;
    if( pOverrides )
    {
        pOverrides->Program = NULL;

        pOverrides->Kernel_CopyBufferBytes = NULL;
        pOverrides->Kernel_CopyBufferUInts = NULL;
        pOverrides->Kernel_CopyBufferUInt4s = NULL;
        pOverrides->Kernel_CopyBufferUInt16s = NULL;

        pOverrides->Kernel_CopyImage2Dto2DFloat = NULL;
        pOverrides->Kernel_CopyImage2Dto2DInt = NULL;
        pOverrides->Kernel_CopyImage2Dto2DUInt = NULL;

        const char* pProgramString = NULL;
        size_t  programStringLength = 0;

        // Get the precompiled kernel string.
        if( errorCode == CL_SUCCESS )
        {
            if( m_OS.GetPrecompiledKernelString(
                    pProgramString,
                    programStringLength ) == false )
            {
                errorCode = CL_INVALID_VALUE;
            }
        }

        // Create the program:
        if( errorCode == CL_SUCCESS )
        {
            pOverrides->Program = dispatch().clCreateProgramWithSource(
                context,
                1,
                &pProgramString,
                &programStringLength,
                &errorCode );
        }

        // Build the program:
        if( errorCode == CL_SUCCESS )
        {
            errorCode = dispatch().clBuildProgram(
                pOverrides->Program,
                0,
                NULL,
                NULL,
                NULL,
                NULL );

            if( errorCode != CL_SUCCESS )
            {
                cl_int  tempErrorCode = CL_SUCCESS;

                // Get the number of devices for this context.
                cl_uint numDevices = 0;
                tempErrorCode = dispatch().clGetContextInfo(
                    context,
                    CL_CONTEXT_NUM_DEVICES,
                    sizeof( numDevices ),
                    &numDevices,
                    NULL );

                if( numDevices != 0 )
                {
                    cl_device_id*   devices = new cl_device_id[ numDevices ];
                    if( devices )
                    {
                        tempErrorCode = dispatch().clGetContextInfo(
                            context,
                            CL_CONTEXT_DEVICES,
                            numDevices * sizeof( cl_device_id ),
                            devices,
                            NULL );

                        if( tempErrorCode == CL_SUCCESS )
                        {
                            for( cl_uint i = 0; i < numDevices; i++ )
                            {
                                size_t  buildLogSize = 0;
                                dispatch().clGetProgramBuildInfo(
                                    pOverrides->Program,
                                    devices[ i ],
                                    CL_PROGRAM_BUILD_LOG,
                                    0,
                                    NULL,
                                    &buildLogSize );

                                char*   buildLog = new char[ buildLogSize + 1 ];
                                if( buildLog )
                                {
                                    dispatch().clGetProgramBuildInfo(
                                        pOverrides->Program,
                                        devices[ i ],
                                        CL_PROGRAM_BUILD_LOG,
                                        buildLogSize * sizeof( char ),
                                        buildLog,
                                        NULL );

                                    buildLog[ buildLogSize ] = '\0';

                                    log( "-------> Start of Build Log:\n" );
                                    log( buildLog );
                                    log( "<------- End of Build Log!\n" );

                                    delete [] buildLog;
                                }
                            }
                        }
                    }
                }
            }
        }

        // Create all of the kernels in the program:

        if( config().OverrideReadBuffer ||
            config().OverrideWriteBuffer ||
            config().OverrideCopyBuffer )
        {
            if( errorCode == CL_SUCCESS )
            {
                pOverrides->Kernel_CopyBufferBytes = dispatch().clCreateKernel(
                    pOverrides->Program,
                    "CopyBufferBytes",
                    &errorCode );
            }
            if( errorCode == CL_SUCCESS )
            {
                pOverrides->Kernel_CopyBufferUInts = dispatch().clCreateKernel(
                    pOverrides->Program,
                    "CopyBufferUInts",
                    &errorCode );
            }
            if( errorCode == CL_SUCCESS )
            {
                pOverrides->Kernel_CopyBufferUInt4s = dispatch().clCreateKernel(
                    pOverrides->Program,
                    "CopyBufferUInt4s",
                    &errorCode );
            }
            if( errorCode == CL_SUCCESS )
            {
                pOverrides->Kernel_CopyBufferUInt16s = dispatch().clCreateKernel(
                    pOverrides->Program,
                    "CopyBufferUInt16s",
                    &errorCode );
            }
        }

        if( config().OverrideReadImage ||
            config().OverrideWriteImage ||
            config().OverrideCopyImage )
        {
            // TODO: Check to see if images are supported?
            //       What should happen if this is a multiple-device context,
            //       and one device supports images, but another doesn't?

            if( errorCode == CL_SUCCESS )
            {
                pOverrides->Kernel_CopyImage2Dto2DFloat = dispatch().clCreateKernel(
                    pOverrides->Program,
                    "CopyImage2Dto2DFloat",
                    &errorCode );
            }
            if( errorCode == CL_SUCCESS )
            {
                pOverrides->Kernel_CopyImage2Dto2DInt = dispatch().clCreateKernel(
                    pOverrides->Program,
                    "CopyImage2Dto2DInt",
                    &errorCode );
            }
            if( errorCode == CL_SUCCESS )
            {
                pOverrides->Kernel_CopyImage2Dto2DUInt = dispatch().clCreateKernel(
                    pOverrides->Program,
                    "CopyImage2Dto2DUInt",
                    &errorCode );
            }
        }

        if( errorCode == CL_SUCCESS )
        {
            m_PrecompiledKernelOverridesMap[ context ] = pOverrides;
        }
        else
        {
            delete pOverrides;
            pOverrides = NULL;
        }
    }

    log( "... precompiled kernel override initialization complete.\n" );
}